

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

bool FIX::Session::sendToTarget(Message *message,string *sender,string *target,string *qualifier)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 local_e0 [16];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  size_t local_90;
  int local_88;
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  char local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  size_t local_30;
  int local_28;
  
  local_80._0_8_ = &PTR__FieldBase_001ed588;
  local_80._8_4_ = 0x31;
  local_70._M_p = local_60;
  pcVar1 = (sender->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + sender->_M_string_length);
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30 = 0;
  local_28 = 0;
  local_80._0_8_ = &PTR__FieldBase_001ed5a8;
  local_e0._0_8_ = &PTR__FieldBase_001ed588;
  local_e0._8_4_ = 0x38;
  local_d0._M_p = local_c0;
  pcVar1 = (target->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + target->_M_string_length);
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90 = 0;
  local_88 = 0;
  local_e0._0_8_ = &PTR__FieldBase_001ed5e0;
  bVar2 = sendToTarget(message,(SenderCompID *)local_80,(TargetCompID *)local_e0,qualifier);
  FieldBase::~FieldBase((FieldBase *)local_e0);
  FieldBase::~FieldBase((FieldBase *)local_80);
  return bVar2;
}

Assistant:

bool Session::sendToTarget
( Message& message, const std::string& sender, const std::string& target,
  const std::string& qualifier )
EXCEPT ( SessionNotFound )
{
  return sendToTarget( message, SenderCompID( sender ),
                       TargetCompID( target ), qualifier );
}